

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaStart(PaAlsaStream *stream,int priming)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  char *pcVar4;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  PaError result;
  int priming_local;
  PaAlsaStream *stream_local;
  
  if ((stream->playback).pcm != (snd_pcm_t *)0x0) {
    if (stream->callbackMode == 0) {
      iVar1 = (*(code *)alsa_snd_pcm_prepare)((stream->playback).pcm);
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar4 = (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2990\n"
                         );
        return -9999;
      }
    }
    else {
      if (priming == 0) {
        iVar1 = (*(code *)alsa_snd_pcm_prepare)((stream->playback).pcm);
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar4 = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2982\n"
                           );
          return -9999;
        }
        if ((stream->playback).canMmap != 0) {
          SilenceBuffer(stream);
        }
      }
      if (((stream->playback).canMmap != 0) &&
         (iVar1 = (*(code *)alsa_snd_pcm_start)((stream->playback).pcm), iVar1 < 0)) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar4 = (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2987\n"
                         );
        return -9999;
      }
    }
  }
  if ((stream->capture).pcm == (snd_pcm_t *)0x0) {
    return 0;
  }
  if (stream->pcmsSynced == 0) {
    iVar1 = (*(code *)alsa_snd_pcm_prepare)((stream->capture).pcm);
    if (iVar1 < 0) {
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar4 = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2994\n"
                       );
    }
    else {
      iVar1 = (*(code *)alsa_snd_pcm_start)((stream->capture).pcm);
      if (-1 < iVar1) {
        return 0;
      }
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar4 = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2996\n"
                       );
    }
    return -9999;
  }
  return 0;
}

Assistant:

static PaError AlsaStart( PaAlsaStream *stream, int priming )
{
    PaError result = paNoError;

    if( stream->playback.pcm )
    {
        if( stream->callbackMode )
        {
            if( !priming )
            {
                /* Buffer isn't primed, so prepare and silence */
                ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
                if( stream->playback.canMmap )
                    SilenceBuffer( stream );
            }
            if( stream->playback.canMmap )
                ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
        else
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
    }
    if( stream->capture.pcm && !stream->pcmsSynced )
    {
        ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );
        /* For a blocking stream we want to start capture as well, since nothing will happen otherwise */
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

end:
    return result;
error:
    goto end;
}